

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgkyc(fitsfile *fptr,char *keyname,float *value,char *comm,int *status)

{
  int iVar1;
  size_t sVar2;
  char valstring [71];
  char message [81];
  
  if (0 < *status) {
    return *status;
  }
  ffgkey(fptr,keyname,valstring,comm,status);
  if (valstring[0] == '(') {
    valstring[0] = ' ';
    sVar2 = strcspn(valstring,")");
    valstring[(int)sVar2] = '\0';
    sVar2 = strcspn(valstring,",");
    valstring[(int)sVar2] = '\0';
    ffc2r(valstring,value,status);
    ffc2r(valstring + ((int)sVar2 + 1),value + 1,status);
    iVar1 = *status;
  }
  else {
    snprintf(message,0x51,"keyword %s does not have a complex value (ffgkyc):",keyname);
    ffpmsg(message);
    ffpmsg(valstring);
    *status = 0x198;
    iVar1 = 0x198;
  }
  return iVar1;
}

Assistant:

int ffgkyc( fitsfile *fptr,     /* I - FITS file pointer         */
            const char  *keyname,     /* I - name of keyword to read   */
            float *value,       /* O - keyword value (real,imag) */
            char  *comm,        /* O - keyword comment           */
            int   *status)      /* IO - error status             */
/*
  Read (get) the named keyword, returning the value and comment.
  The keyword must have a complex value. No implicit data conversion
  will be performed.
*/
{
    char valstring[FLEN_VALUE], message[FLEN_ERRMSG];
    int len;

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */

    if (valstring[0] != '(' )   /* test that this is a complex keyword */
    {
      snprintf(message, FLEN_ERRMSG, "keyword %s does not have a complex value (ffgkyc):",
              keyname);
      ffpmsg(message);
      ffpmsg(valstring);
      return(*status = BAD_C2F);
    }

    valstring[0] = ' ';            /* delete the opening parenthesis */
    len = strcspn(valstring, ")" );  
    valstring[len] = '\0';         /* delete the closing parenthesis */

    len = strcspn(valstring, ",");
    valstring[len] = '\0';

    ffc2r(valstring, &value[0], status);       /* convert the real part */
    ffc2r(&valstring[len + 1], &value[1], status); /* convert imag. part */
    return(*status);
}